

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall
OpenSteer::Camera::smoothCameraMove
          (Camera *this,Vec3 *newPosition,Vec3 *newTarget,Vec3 *newUp,float elapsedTime)

{
  bool bVar1;
  undefined8 *in_RCX;
  Vec3 *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  Vec3 VVar4;
  Vec3 tempUp;
  Vec3 tempPosition;
  float smoothRate;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  Vec3 *in_stack_fffffffffffffdd8;
  float in_stack_fffffffffffffde4;
  undefined8 local_188;
  Vec3 local_f4;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  float local_28;
  undefined8 *local_20;
  Vec3 *local_18;
  
  if ((*(byte *)((long)in_RDI + 0x54) & 1) == 0) {
    *(undefined1 *)((long)in_RDI + 0x54) = 1;
    local_20 = in_RCX;
    local_18 = in_RDX;
    (**(code **)(*in_RDI + 0x48))(*in_RSI);
    Vec3::operator=((Vec3 *)(in_RDI + 7),local_18);
    (**(code **)(*in_RDI + 0x28))(*local_20);
  }
  else {
    fVar2 = *(float *)(in_RDI + 0xb);
    local_28 = in_XMM0_Da * fVar2;
    local_48 = (**(code **)(*in_RDI + 0x40))();
    local_40 = fVar2;
    local_38 = local_48;
    local_30 = fVar2;
    local_68 = (**(code **)(*in_RDI + 0x20))();
    local_60 = fVar2;
    local_58 = local_68;
    local_50 = fVar2;
    blendIntoAccumulator<OpenSteer::Vec3>
              (in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8,
               (Vec3 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    blendIntoAccumulator<OpenSteer::Vec3>
              (in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8,
               (Vec3 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    blendIntoAccumulator<OpenSteer::Vec3>
              (in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8,
               (Vec3 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    local_70 = local_30;
    local_78 = local_38;
    local_80 = local_30;
    local_88 = local_38;
    fVar2 = local_30;
    local_a8 = (**(code **)(*in_RDI + 0x48))(local_38);
    local_b0 = local_50;
    local_b8 = local_58;
    local_c0 = local_50;
    local_c8 = local_58;
    fVar3 = local_50;
    local_a0 = fVar2;
    local_98 = local_a8;
    local_90 = fVar2;
    local_e8 = (**(code **)(*in_RDI + 0x28))(local_58);
    local_e0 = fVar3;
    local_d8 = local_e8;
    local_d0 = fVar3;
    local_f4._0_8_ = (**(code **)(*in_RDI + 0x20))();
    local_f4.z = fVar3;
    bVar1 = Vec3::operator==(&local_f4,&Vec3::zero);
    if (bVar1) {
      (**(code **)(*in_RDI + 0x28))(Vec3::up._0_8_);
    }
    else {
      (**(code **)(*in_RDI + 0x20))();
      VVar4 = Vec3::normalize((Vec3 *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
      ;
      local_188 = VVar4._0_8_;
      (**(code **)(*in_RDI + 0x28))(local_188);
    }
  }
  return;
}

Assistant:

void 
OpenSteer::Camera::smoothCameraMove (const Vec3& newPosition,
                                     const Vec3& newTarget,
                                     const Vec3& newUp,
                                     const float elapsedTime)
{
    if (smoothNextMove)
    {
        const float smoothRate = elapsedTime * smoothMoveSpeed;

        Vec3 tempPosition = position();
        Vec3 tempUp = up();
        blendIntoAccumulator (smoothRate, newPosition, tempPosition);
        blendIntoAccumulator (smoothRate, newTarget,   target);
        blendIntoAccumulator (smoothRate, newUp,       tempUp);
        setPosition (tempPosition);
        setUp (tempUp);

        // xxx not sure if these are needed, seems like a good idea
        // xxx (also if either up or oldUP are zero, use the other?)
        // xxx (even better: force up to be perp to target-position axis))
        if (up() == Vec3::zero)
            setUp (Vec3::up);
        else
            setUp (up().normalize ());
    }
    else
    {
        smoothNextMove = true;

        setPosition (newPosition);
        target   = newTarget;
        setUp (newUp);
    }
}